

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall
QtMWidgets::TableViewSection::insertCell(TableViewSection *this,int index,TableViewCell *cell)

{
  long lVar1;
  RowsSeparator *this_00;
  int iVar2;
  
  if (index < 0 || cell == (TableViewCell *)0x0) {
    return;
  }
  lVar1 = (((this->d).d)->cells).d.size;
  iVar2 = (int)lVar1;
  if (lVar1 < (long)(ulong)(uint)index) {
    index = iVar2;
  }
  if (index == 0) {
    iVar2 = 1;
  }
  else {
    this_00 = (RowsSeparator *)operator_new(0x28);
    RowsSeparator::RowsSeparator(this_00,&this->super_QWidget);
    QBoxLayout::insertWidget(((this->d).d)->layout,index + iVar2,this_00,0,0);
    QList<QtMWidgets::RowsSeparator_*>::insert
              (&((this->d).d)->separators,(long)(index + -1),this_00);
    QWidget::show();
    iVar2 = index + iVar2 + 1;
  }
  if (*(TableViewSection **)(*(long *)&cell->field_0x8 + 0x10) != this) {
    QWidget::setParent(&cell->super_QWidget);
  }
  QBoxLayout::insertWidget(((this->d).d)->layout,iVar2,cell,0,0);
  QList<QtMWidgets::TableViewCell_*>::insert(&((this->d).d)->cells,(long)index,cell);
  ((cell->d).d)->highlightOnClick = ((this->d).d)->highlightCellOnClick;
  QWidget::show();
  return;
}

Assistant:

void
TableViewSection::insertCell( int index, TableViewCell * cell )
{
	if( !cell || index < 0 )
		return;

	if( index > d->cells.size() )
		index = d->cells.size();

	int actualIndex = ( index == 0 ? 1 : index + d->cells.size() );

	if( index != 0 )
	{
		RowsSeparator * s = new RowsSeparator( this );
		d->layout->insertWidget( actualIndex, s );
		d->separators.insert( index - 1, s );
		s->show();
		++actualIndex;
	}

	if( cell->parent() != this )
		cell->setParent( this );
	d->layout->insertWidget( actualIndex, cell );
	d->cells.insert( index, cell );
	cell->setHighlightOnClick( d->highlightCellOnClick );
	cell->show();
}